

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

void __thiscall BackwardPass::TrackFloatSymEquivalence(BackwardPass *this,Instr *instr)

{
  Type TVar1;
  StackSym *sym;
  StackSym *sym_00;
  FloatSymEquivalenceClass *pFVar2;
  Type pJVar3;
  long lVar4;
  code *pcVar5;
  bool bVar6;
  bool bVar7;
  BOOLEAN BVar8;
  BailOutKind BVar9;
  undefined4 *puVar10;
  RegOpnd *pRVar11;
  FloatSymEquivalenceClass **value;
  SparseBVUnit key;
  FloatSymEquivalenceMap *this_00;
  BVUnitT<unsigned_long> local_60;
  SparseBVUnit _unit;
  uint local_4c;
  FloatSymEquivalenceClass *pFStack_48;
  BVIndex id;
  FloatSymEquivalenceClass *srcEquivalenceClass;
  FloatSymEquivalenceClass *local_38;
  FloatSymEquivalenceClass *dstEquivalenceClass;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1db2,"(instr)","instr");
    if (!bVar6) goto LAB_003ce850;
    *puVar10 = 0;
  }
  if (this->tag != DeadStorePhase) {
    return;
  }
  if (instr->m_src2 != (Opnd *)0x0) {
    return;
  }
  if ((instr->m_func->field_0x240 & 0x10) == 0) {
    return;
  }
  if (instr->m_dst == (Opnd *)0x0) {
    return;
  }
  bVar6 = IR::Opnd::IsRegOpnd(instr->m_dst);
  if (!bVar6) {
    return;
  }
  pRVar11 = IR::Opnd::AsRegOpnd(instr->m_dst);
  sym = pRVar11->m_sym;
  if (sym->m_type != TyFloat64) {
    return;
  }
  if (instr->m_src1 == (Opnd *)0x0) {
    return;
  }
  bVar6 = IR::Opnd::IsRegOpnd(instr->m_src1);
  if (!bVar6) {
    return;
  }
  pRVar11 = IR::Opnd::AsRegOpnd(instr->m_src1);
  sym_00 = pRVar11->m_sym;
  bVar6 = OpCodeAttr::NonIntTransfer(instr->m_opcode);
  if ((!bVar6) ||
     ((this->currentBlock->loop != (Loop *)0x0 && (this->currentPrePassLoop == (Loop *)0x0)))) {
    if ((instr->field_0x38 & 0x10) == 0) {
      return;
    }
    BVar9 = IR::Instr::GetBailOutKind(instr);
    if (BVar9 != BailOutPrimitiveButString) {
      return;
    }
    if (instr->m_opcode != FromVar) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x1e14,"(instr->m_opcode == Js::OpCode::FromVar)",
                         "instr->m_opcode == Js::OpCode::FromVar");
      if (!bVar6) goto LAB_003ce850;
      *puVar10 = 0;
    }
    local_38 = (FloatSymEquivalenceClass *)0x0;
    if ((sym->field_0x1a & 2) == 0) {
      bVar6 = JsUtil::
              BaseDictionary<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::TryGetValue<unsigned_int>
                        (this->floatSymEquivalenceMap,&(sym->super_Sym).m_id,&local_38);
      if (!bVar6) {
        return;
      }
      if (local_38->requiresBailOnNotNumber != true) {
        return;
      }
    }
    IR::Instr::SetBailOutKind(instr,BailOutNumberOnly);
    return;
  }
  if (sym_00->m_type != TyFloat64) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1dcb,"(src->IsFloat64())","src->IsFloat64()");
    if (!bVar6) goto LAB_003ce850;
    *puVar10 = 0;
  }
  if (sym == sym_00) {
    return;
  }
  if (this->func->m_fg->hasLoop == false) {
    if ((sym->field_0x1a & 2) == 0) {
      return;
    }
    sym_00->field_0x1a = sym_00->field_0x1a | 2;
    return;
  }
  local_38 = (FloatSymEquivalenceClass *)0x0;
  value = &stack0xffffffffffffffb8;
  pFStack_48 = (FloatSymEquivalenceClass *)0x0;
  srcEquivalenceClass = (FloatSymEquivalenceClass *)&(sym->super_Sym).m_id;
  bVar6 = JsUtil::
          BaseDictionary<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetValue<unsigned_int>
                    (this->floatSymEquivalenceMap,(uint *)srcEquivalenceClass,&local_38);
  _unit.word = (Type)&(sym_00->super_Sym).m_id;
  bVar7 = JsUtil::
          BaseDictionary<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetValue<unsigned_int>(this->floatSymEquivalenceMap,(uint *)_unit.word,value);
  if (bVar6) {
    if (bVar7) {
      if (local_38 == pFStack_48) {
        return;
      }
      BVar8 = BVSparse<Memory::JitArenaAllocator>::Test(&local_38->bv,*(BVIndex *)_unit.word);
      if (BVar8 != '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x1dfd,"(!dstEquivalenceClass->Bv()->Test(src->m_id))",
                           "!dstEquivalenceClass->Bv()->Test(src->m_id)");
        if (!bVar6) goto LAB_003ce850;
        *puVar10 = 0;
      }
      BVar8 = BVSparse<Memory::JitArenaAllocator>::Test
                        (&pFStack_48->bv,*(BVIndex *)&(srcEquivalenceClass->bv).head);
      if (BVar8 != '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x1dfe,"(!srcEquivalenceClass->Bv()->Test(dst->m_id))",
                           "!srcEquivalenceClass->Bv()->Test(dst->m_id)");
        if (!bVar6) {
LAB_003ce850:
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
        *puVar10 = 0;
      }
      FloatSymEquivalenceClass::Or(local_38,pFStack_48);
      srcEquivalenceClass = pFStack_48;
      while (pFVar2 = (FloatSymEquivalenceClass *)(srcEquivalenceClass->bv).head,
            pFVar2 != (FloatSymEquivalenceClass *)0x0) {
        TVar1 = *(Type *)&(pFVar2->bv).lastFoundIndex;
        local_60.word = ((Type *)&(pFVar2->bv).alloc)->word;
        srcEquivalenceClass = pFVar2;
        while (local_60.word != 0) {
          lVar4 = 0;
          if (local_60.word != 0) {
            for (; (local_60.word >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
            }
          }
          local_4c = (BVIndex)lVar4 + TVar1;
          BVUnitT<unsigned_long>::Clear(&local_60,(BVIndex)lVar4);
          JsUtil::
          BaseDictionary<unsigned_int,BackwardPass::FloatSymEquivalenceClass*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::
          Insert<(JsUtil::BaseDictionary<unsigned_int,BackwardPass::FloatSymEquivalenceClass*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
                    ((BaseDictionary<unsigned_int,BackwardPass::FloatSymEquivalenceClass*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this->floatSymEquivalenceMap,&local_4c,&local_38);
        }
      }
      Memory::
      DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BackwardPass::FloatSymEquivalenceClass>
                (this->tempAlloc,pFStack_48);
      return;
    }
  }
  else {
    if (bVar7) {
      FloatSymEquivalenceClass::Set(pFStack_48,sym);
      this_00 = this->floatSymEquivalenceMap;
      key.word = (Type)srcEquivalenceClass;
      goto LAB_003ce82d;
    }
    local_38 = (FloatSymEquivalenceClass *)
               new<Memory::JitArenaAllocator>(0x28,this->tempAlloc,0x3d6ef4);
    pJVar3 = this->tempAlloc;
    (local_38->bv).head = (Type_conflict)0x0;
    (local_38->bv).lastFoundIndex = (Type_conflict)0x0;
    (local_38->bv).alloc = pJVar3;
    (local_38->bv).lastUsedNodePrevNextField = (Type)local_38;
    local_38->requiresBailOnNotNumber = false;
    FloatSymEquivalenceClass::Set(local_38,sym);
    JsUtil::
    BaseDictionary<unsigned_int,BackwardPass::FloatSymEquivalenceClass*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<unsigned_int,BackwardPass::FloatSymEquivalenceClass*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<unsigned_int,BackwardPass::FloatSymEquivalenceClass*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)this->floatSymEquivalenceMap,(uint *)srcEquivalenceClass,&local_38);
  }
  value = &local_38;
  FloatSymEquivalenceClass::Set(local_38,sym_00);
  this_00 = this->floatSymEquivalenceMap;
  key = _unit;
LAB_003ce82d:
  JsUtil::
  BaseDictionary<unsigned_int,BackwardPass::FloatSymEquivalenceClass*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<unsigned_int,BackwardPass::FloatSymEquivalenceClass*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
            ((BaseDictionary<unsigned_int,BackwardPass::FloatSymEquivalenceClass*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)this_00,(uint *)key.word,value);
  return;
}

Assistant:

void
BackwardPass::TrackFloatSymEquivalence(IR::Instr *const instr)
{
    /*
    This function determines sets of float-specialized syms where any two syms in a set may have the same value number at some
    point in the function. Conversely, if two float-specialized syms are not in the same set, it guarantees that those two syms
    will never have the same value number. These sets are referred to as equivalence classes here.

    The equivalence class for a sym is used to determine whether a bailout FromVar generating a float value for the sym needs to
    bail out on any non-number value. For instance, for syms s1 and s5 in an equivalence class (say we have s5 = s1 at some
    point), if there's a FromVar that generates a float value for s1 but only bails out on strings or non-primitives, and s5 is
    returned from the function, it has to be ensured that s5 is not converted to Var. If the source of the FromVar was null, the
    FromVar would not have bailed out, and s1 and s5 would have the value +0. When s5 is returned, we need to return null and
    not +0, so the equivalence class is used to determine that since s5 requires a bailout on any non-number value, so does s1.

    The tracking is very conservative because the bit that says "I require bailout on any non-number value" is on the sym itself
    (referred to as non-number bailout bit below).

    Data:
    - BackwardPass::floatSymEquivalenceMap
        - hash table mapping a float sym ID to its equivalence class
    - FloatSymEquivalenceClass
        - bit vector of float sym IDs that are in the equivalence class
        - one non-number bailout bit for all syms in the equivalence class

    Algorithm:
    - In a loop prepass or when not in loop:
        - For a float sym transfer (s0.f = s1.f), add both syms to an equivalence class (set the syms in a bit vector)
            - If either sym requires bailout on any non-number value, set the equivalence class' non-number bailout bit
        - If one of the syms is already in an equivalence class, merge the two equivalence classes by OR'ing the two bit vectors
          and the non-number bailout bit.
        - Note that for functions with a loop, dependency tracking is done using equivalence classes and that information is not
          transferred back into each sym's non-number bailout bit
    - In a loop non-prepass or when not in loop, for a FromVar instruction that requires bailout only on strings and
      non-primitives:
        - If the destination float sym's non-number bailout bit is set, or the sym is in an equivalence class whose non-number
          bailout bit is set, change the bailout to bail out on any non-number value

    The result is that if a float-specialized sym's value is used in a way in which it would be invalid to use the float value
    through any other float-specialized sym that acquires the value, the FromVar generating the float value will be modified to
    bail out on any non-number value.
    */

    Assert(instr);

    if(tag != Js::DeadStorePhase || instr->GetSrc2() || !instr->m_func->hasBailout)
    {
        return;
    }

    if(!instr->GetDst() || !instr->GetDst()->IsRegOpnd())
    {
        return;
    }
    const auto dst = instr->GetDst()->AsRegOpnd()->m_sym;
    if(!dst->IsFloat64())
    {
        return;
    }

    if(!instr->GetSrc1() || !instr->GetSrc1()->IsRegOpnd())
    {
        return;
    }
    const auto src = instr->GetSrc1()->AsRegOpnd()->m_sym;

    if(OpCodeAttr::NonIntTransfer(instr->m_opcode) && (!currentBlock->loop || IsPrePass()))
    {
        Assert(src->IsFloat64()); // dst is specialized, and since this is a float transfer, src must be specialized too

        if(dst == src)
        {
            return;
        }

        if(!func->m_fg->hasLoop)
        {
            // Special case for functions with no loops, since there can only be in-order dependencies. Just merge the two
            // non-number bailout bits and put the result in the source.
            if(dst->m_requiresBailOnNotNumber)
            {
                src->m_requiresBailOnNotNumber = true;
            }
            return;
        }

        FloatSymEquivalenceClass *dstEquivalenceClass = nullptr, *srcEquivalenceClass = nullptr;
        const bool dstHasEquivalenceClass = floatSymEquivalenceMap->TryGetValue(dst->m_id, &dstEquivalenceClass);
        const bool srcHasEquivalenceClass = floatSymEquivalenceMap->TryGetValue(src->m_id, &srcEquivalenceClass);

        if(!dstHasEquivalenceClass)
        {
            if(srcHasEquivalenceClass)
            {
                // Just add the destination into the source's equivalence class
                srcEquivalenceClass->Set(dst);
                floatSymEquivalenceMap->Add(dst->m_id, srcEquivalenceClass);
                return;
            }

            dstEquivalenceClass = JitAnew(tempAlloc, FloatSymEquivalenceClass, tempAlloc);
            dstEquivalenceClass->Set(dst);
            floatSymEquivalenceMap->Add(dst->m_id, dstEquivalenceClass);
        }

        if(!srcHasEquivalenceClass)
        {
            // Just add the source into the destination's equivalence class
            dstEquivalenceClass->Set(src);
            floatSymEquivalenceMap->Add(src->m_id, dstEquivalenceClass);
            return;
        }

        if(dstEquivalenceClass == srcEquivalenceClass)
        {
            return;
        }

        Assert(!dstEquivalenceClass->Bv()->Test(src->m_id));
        Assert(!srcEquivalenceClass->Bv()->Test(dst->m_id));

        // Merge the two equivalence classes. The source's equivalence class is typically smaller, so it's merged into the
        // destination's equivalence class. To save space and prevent a potential explosion of bit vector size,
        // 'floatSymEquivalenceMap' is updated for syms in the source's equivalence class to map to the destination's now merged
        // equivalence class, and the source's equivalence class is discarded.
        dstEquivalenceClass->Or(srcEquivalenceClass);
        FOREACH_BITSET_IN_SPARSEBV(id, srcEquivalenceClass->Bv())
        {
            floatSymEquivalenceMap->Item(id, dstEquivalenceClass);
        } NEXT_BITSET_IN_SPARSEBV;
        JitAdelete(tempAlloc, srcEquivalenceClass);

        return;
    }

    // Not a float transfer, and non-prepass (not necessarily in a loop)

    if(!instr->HasBailOutInfo() || instr->GetBailOutKind() != IR::BailOutPrimitiveButString)
    {
        return;
    }
    Assert(instr->m_opcode == Js::OpCode::FromVar);

    // If either the destination or its equivalence class says it requires bailout on any non-number value, adjust the bailout
    // kind on the instruction. Both are checked because in functions without loops, equivalence tracking is not done and only
    // the sym's non-number bailout bit will have the information, and in functions with loops, equivalence tracking is done
    // throughout the function and checking just the sym's non-number bailout bit is insufficient.
    FloatSymEquivalenceClass *dstEquivalenceClass = nullptr;
    if(dst->m_requiresBailOnNotNumber ||
        (floatSymEquivalenceMap->TryGetValue(dst->m_id, &dstEquivalenceClass) && dstEquivalenceClass->RequiresBailOnNotNumber()))
    {
        instr->SetBailOutKind(IR::BailOutNumberOnly);
    }
}